

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O0

void gtk_up_box(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color FVar1;
  Fl_Color c_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  gtk_up_frame(x,y,w,h,c);
  FVar1 = fl_color_average(0xff,c,0.4);
  gtk_color(FVar1);
  fl_xyline(x + 2,y + 2,x + w + -3);
  FVar1 = fl_color_average(0xff,c,0.2);
  gtk_color(FVar1);
  fl_xyline(x + 2,y + 3,x + w + -3);
  FVar1 = fl_color_average(0xff,c,0.1);
  gtk_color(FVar1);
  fl_xyline(x + 2,y + 4,x + w + -3);
  gtk_color(c);
  fl_rectf(x + 2,y + 5,w + -4,h + -7);
  FVar1 = fl_color_average(0x38,c,0.025);
  gtk_color(FVar1);
  fl_xyline(x + 2,y + h + -4,x + w + -3);
  FVar1 = fl_color_average(0x38,c,0.05);
  gtk_color(FVar1);
  fl_xyline(x + 2,y + h + -3,x + w + -3);
  FVar1 = fl_color_average(0x38,c,0.1);
  gtk_color(FVar1);
  fl_xyline(x + 2,y + h + -2,x + w + -3);
  fl_yxline(x + w + -2,y + 2,y + h + -3);
  return;
}

Assistant:

static void gtk_up_box(int x, int y, int w, int h, Fl_Color c) {
  gtk_up_frame(x, y, w, h, c);

  gtk_color(fl_color_average(FL_WHITE, c, 0.4f));
  fl_xyline(x + 2, y + 2, x + w - 3);
  gtk_color(fl_color_average(FL_WHITE, c, 0.2f));
  fl_xyline(x + 2, y + 3, x + w - 3);
  gtk_color(fl_color_average(FL_WHITE, c, 0.1f));
  fl_xyline(x + 2, y + 4, x + w - 3);
  gtk_color(c);
  fl_rectf(x + 2, y + 5, w - 4, h - 7);
  gtk_color(fl_color_average(FL_BLACK, c, 0.025f));
  fl_xyline(x + 2, y + h - 4, x + w - 3);
  gtk_color(fl_color_average(FL_BLACK, c, 0.05f));
  fl_xyline(x + 2, y + h - 3, x + w - 3);
  gtk_color(fl_color_average(FL_BLACK, c, 0.1f));
  fl_xyline(x + 2, y + h - 2, x + w - 3);
  fl_yxline(x + w - 2, y + 2, y + h - 3);
}